

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O2

void dump_regmat_statistics
               (float64 *****regl,float64 ****regr,uint32 nclass,uint32 nfeat,uint32 *veclen)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puts("regl");
  for (uVar4 = 0; uVar4 != nclass; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar5 != nfeat; uVar5 = uVar5 + 1) {
      uVar2 = (ulong)veclen[uVar5];
      for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
        printf("class: %d, stream: %d, mixture %d\n",uVar4 & 0xffffffff,uVar5 & 0xffffffff,
               uVar3 & 0xffffffff);
        for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
          printf("%d ",uVar6 & 0xffffffff);
          for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
            printf("%f ",regl[uVar4][uVar5][uVar3][uVar6][uVar7]);
          }
          putchar(10);
        }
      }
    }
  }
  puts("regr");
  for (uVar4 = 0; uVar4 != nclass; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar5 != nfeat; uVar5 = uVar5 + 1) {
      uVar1 = veclen[uVar5];
      for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
        printf("class: %d, stream: %d, mixture %d\n",uVar4 & 0xffffffff,uVar5 & 0xffffffff,
               uVar2 & 0xffffffff);
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          printf("%f ",regr[uVar4][uVar5][uVar2][uVar3]);
        }
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void dump_regmat_statistics(float64 *****regl,
		       float64 ****regr,
		       uint32 nclass,
		       uint32 nfeat,
		       const uint32  *veclen)

{
  uint32  i,j,k,l,m,len;

  printf("regl\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%d ", j);
	  for(k=0;k<len;k++){
	    printf("%f ",regl[m][i][l][j][k]);
	  }
	    printf("\n");
	}
	}
    }
  }
  
  printf("regr\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%f ",regr[m][i][l][j]);
	}
	printf("\n");
      }
    }
  }
    
}